

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertUnsignedLongLongsEqual
          (UtestShell *this,cpputest_ulonglong expected,cpputest_ulonglong actual,char *text,
          char *fileName,int lineNumber,TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  SimpleString *in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined4 in_R9D;
  undefined8 in_stack_00000008;
  UtestShell *in_stack_ffffffffffffff38;
  SimpleString *in_stack_ffffffffffffff40;
  undefined1 local_70 [24];
  cpputest_ulonglong in_stack_ffffffffffffffa8;
  cpputest_ulonglong in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  UtestShell *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  pTVar1 = getTestResult(in_stack_ffffffffffffff38);
  (*pTVar1->_vptr_TestResult[10])();
  if (in_RSI != in_RDX) {
    SimpleString::SimpleString(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    UnsignedLongLongsEqualFailure::UnsignedLongLongsEqualFailure
              ((UnsignedLongLongsEqualFailure *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RCX);
    (**(code **)(*in_RDI + 0x128))(in_RDI,local_70,in_stack_00000008);
    UnsignedLongLongsEqualFailure::~UnsignedLongLongsEqualFailure
              ((UnsignedLongLongsEqualFailure *)0x2196c2);
    SimpleString::~SimpleString((SimpleString *)0x2196cc);
  }
  return;
}

Assistant:

void UtestShell::assertUnsignedLongLongsEqual(cpputest_ulonglong expected, cpputest_ulonglong actual, const char* text, const char* fileName, int lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
#ifdef CPPUTEST_USE_LONG_LONG
    if (expected != actual)
        failWith(UnsignedLongLongsEqualFailure(this, fileName, lineNumber, expected, actual, text), testTerminator);
#else
    (void)expected;
    (void)actual;
    failWith(FeatureUnsupportedFailure(this, fileName, lineNumber, "CPPUTEST_USE_LONG_LONG", text), testTerminator);
#endif
}